

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

char * cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  session_interface *psVar2;
  size_type sVar3;
  char *pcVar4;
  cppcms_capi_session *pcVar5;
  bool bVar6;
  string *psVar7;
  ulong uVar8;
  uint uVar9;
  string tmp;
  allocator local_59;
  cppcms_capi_session *local_58;
  string local_50;
  
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_418ba7::check_str(key);
    cppcms_capi_session::check_loaded(session);
    psVar2 = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_50,key,&local_59);
    bVar6 = cppcms::session_interface::is_set(psVar2,&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (bVar6) {
      psVar2 = (session->p).ptr_;
      local_58 = session;
      std::__cxx11::string::string((string *)&local_50,key,&local_59);
      psVar7 = cppcms::session_interface::operator[](psVar2,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      sVar3 = psVar7->_M_string_length;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::reserve((ulong)&local_50);
      uVar9 = (uint)sVar3;
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_50);
          std::__cxx11::string::push_back((char)&local_50);
          uVar8 = uVar8 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar8);
      }
      pcVar5 = local_58;
      std::__cxx11::string::swap((string *)&local_58->returned_value);
      pcVar4 = (pcVar5->returned_value)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return pcVar4;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();

		if(!session->p->is_set(key))
			return 0;
		std::string const &value = (*(session->p))[key];
		std::string tmp;
		int len = value.size();
		tmp.reserve(len*2);
		for(int i=0;i<len;i++) {
			static char const *digits="0123456789abcdef";
			unsigned char c=value[i];
			tmp+=digits[(c >> 4u & 0xFu)];
			tmp+=digits[(c & 0xFu)];
		}
		session->returned_value.swap(tmp);
		return session->returned_value.c_str();
	}